

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::EdgeChainSimplifier::Run(EdgeChainSimplifier *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  int iVar1;
  int iVar2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar3;
  bool bVar4;
  ulong *puVar5;
  Graph *pGVar6;
  pointer ppVar7;
  pointer ppVar8;
  ulong uVar9;
  EdgeId e;
  long lVar10;
  int e_2;
  VertexId v;
  size_type sVar11;
  EdgeId e_1;
  long lVar12;
  reference rVar13;
  
  this_00 = &this->is_interior_;
  for (sVar11 = 0; pGVar6 = this->g_, (long)sVar11 < (long)pGVar6->num_vertices_;
      sVar11 = sVar11 + 1) {
    bVar4 = IsInterior(this,(VertexId)sVar11);
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar11);
    puVar5 = rVar13._M_p;
    if (bVar4) {
      uVar9 = rVar13._M_mask | *puVar5;
    }
    else {
      uVar9 = ~rVar13._M_mask & *puVar5;
    }
    *puVar5 = uVar9;
  }
  sVar11 = 0;
  while( true ) {
    ppVar8 = (pGVar6->edges_->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    ppVar7 = (pGVar6->edges_->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if ((long)(int)((ulong)((long)ppVar7 - (long)ppVar8) >> 3) <= (long)sVar11) break;
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,sVar11);
    if ((*rVar13._M_p & rVar13._M_mask) == 0) {
      ppVar8 = (this->g_->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar1 = ppVar8[sVar11].first;
      iVar2 = ppVar8[sVar11].second;
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)iVar1);
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)iVar2);
        if ((*rVar13._M_p & rVar13._M_mask) == 0) {
          OutputEdge(this,(EdgeId)sVar11);
        }
        else {
          SimplifyChain(this,iVar1,iVar2);
        }
      }
    }
    sVar11 = sVar11 + 1;
    pGVar6 = this->g_;
  }
  for (sVar11 = 0; (long)sVar11 < (long)(int)((ulong)((long)ppVar7 - (long)ppVar8) >> 3);
      sVar11 = sVar11 + 1) {
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,sVar11);
    if ((*rVar13._M_p & rVar13._M_mask) == 0) {
      ppVar8 = (this->g_->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar1 = ppVar8[sVar11].first;
      iVar2 = ppVar8[sVar11].second;
      if (iVar1 == iVar2) {
        OutputEdge(this,(EdgeId)sVar11);
      }
      else {
        SimplifyChain(this,iVar1,iVar2);
      }
    }
    pvVar3 = this->g_->edges_;
    ppVar8 = (pvVar3->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar7 = (pvVar3->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  lVar12 = 0;
  lVar10 = 0;
  for (uVar9 = 0;
      ppVar8 = (this->new_edges_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)((long)(this->new_edges_).
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8 >> 3);
      uVar9 = uVar9 + 1) {
    iVar1 = (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9];
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((this->layer_edges_->
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + iVar1,
               (value_type *)((long)&ppVar8->first + lVar10));
    std::vector<int,_std::allocator<int>_>::push_back
              ((this->layer_input_edge_ids_->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + iVar1,
               (value_type_conflict2 *)
               ((long)(this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar10 = lVar10 + 8;
    lVar12 = lVar12 + 4;
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::Run() {
  // Determine which vertices can be interior vertices of an edge chain.
  for (VertexId v = 0; v < g_.num_vertices(); ++v) {
    is_interior_[v] = IsInterior(v);
  }
  // Attempt to simplify all edge chains that start from a non-interior
  // vertex.  (This takes care of all chains except loops.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (is_interior_[edge.first]) continue;
    if (!is_interior_[edge.second]) {
      OutputEdge(e);  // An edge between two non-interior vertices.
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }
  // If there are any edges left, they form one or more disjoint loops where
  // all vertices are interior vertices.
  //
  // TODO(ericv): It would be better to start from the edge with the smallest
  // min_input_edge_id(), since that would make the output more predictable
  // for testing purposes.  It also means that we won't create an edge that
  // spans the start and end of a polyline if the polyline is snapped into a
  // loop.  (Unfortunately there are pathological examples that prevent us
  // from guaranteeing this in general, e.g. there could be two polylines in
  // different layers that snap to the same loop but start at different
  // positions.  In general we only consider input edge ids to be a hint
  // towards the preferred output ordering.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (edge.first == edge.second) {
      // Note that it is safe to output degenerate edges as we go along,
      // because this vertex has at least one non-degenerate outgoing edge and
      // therefore we will (or just did) start an edge chain here.
      OutputEdge(e);
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }

  // Finally, copy the output edges into the appropriate layers.  They don't
  // need to be sorted because the input edges were also unsorted.
  for (int e = 0; e < new_edges_.size(); ++e) {
    int layer = new_edge_layers_[e];
    (*layer_edges_)[layer].push_back(new_edges_[e]);
    (*layer_input_edge_ids_)[layer].push_back(new_input_edge_ids_[e]);
  }
}